

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCombinable.h
# Opt level: O0

void __thiscall
HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>
::~HighsCombinable(HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
                   *this)

{
  bool bVar1;
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  *in_RDI;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[],_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                      *)0x532b2c);
  if (bVar1) {
    clear(in_RDI);
  }
  std::
  unique_ptr<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>::PaddedData[],_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>::PaddedData[]>_>
  ::~unique_ptr((unique_ptr<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[],_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                 *)in_RDI);
  return;
}

Assistant:

~HighsCombinable() {
    if (threadCopies_) clear();
  }